

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileIf(jx9_gen_state *pGen)

{
  SyToken *pSVar1;
  uint uVar2;
  GenBlock *pBlock;
  sxi32 sVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  sxi32 sVar7;
  SyToken *pSVar8;
  SyToken *pSVar9;
  SyToken *pSVar10;
  SyToken *pSVar11;
  sxu32 nJumpIdx;
  GenBlock *pCondBlock;
  sxu32 local_44;
  GenBlock *local_40;
  undefined4 local_38;
  sxu32 local_34;
  
  local_40 = (GenBlock *)0x0;
  pSVar9 = pGen->pIn + 1;
  pGen->pIn = pSVar9;
  sVar3 = GenStateEnterBlock(pGen,4,pGen->pVm->pByteContainer->nUsed,(void *)0x0,&local_40);
  sVar7 = -10;
  if (sVar3 == 0) {
    pSVar10 = pGen->pEnd;
    lVar4 = -0x20;
    if (pSVar9 < pSVar10) {
      do {
        if ((pSVar9->nType & 0x200) == 0) {
          lVar4 = 0;
          goto LAB_001259a6;
        }
        pSVar1 = pSVar9 + 1;
        pSVar11 = pSVar9;
        if (pSVar10 <= pSVar1) {
LAB_001258bf:
          sVar3 = jx9GenCompileError(pGen,1,pSVar11->nLine,"if/else/elseif: Missing \')\'");
          if (sVar3 == -10) {
            return -10;
          }
          goto LAB_001259ca;
        }
        uVar5 = 0x20;
        iVar6 = 1;
        do {
          uVar2 = *(uint *)((long)&pSVar9->nType + uVar5);
          pSVar11 = pSVar1;
          if ((uVar2 >> 9 & 1) == 0) {
            if ((uVar2 >> 10 & 1) != 0) {
              if (iVar6 < 2) {
                if (uVar5 < 0x21) goto LAB_001258bf;
                break;
              }
              iVar6 = iVar6 + -1;
            }
          }
          else {
            iVar6 = iVar6 + 1;
          }
          pSVar8 = (SyToken *)((long)&pSVar9[1].sData.zString + uVar5);
          uVar5 = uVar5 + 0x20;
        } while (pSVar8 < pSVar10);
        if ((*(byte *)((long)&pSVar9->nType + uVar5 + 1) & 4) == 0) goto LAB_001258bf;
        pSVar11 = (SyToken *)((long)&(pSVar9->sData).zString + uVar5);
        pGen->pIn = pSVar1;
        pGen->pEnd = pSVar11;
        sVar3 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
        pSVar9 = pGen->pIn;
        while (pSVar9 < pSVar11) {
          jx9GenCompileError(pGen,1,pSVar9->nLine,"Unexpected token \'%z\'");
          pSVar9 = pGen->pIn + 1;
          pGen->pIn = pSVar9;
        }
        pGen->pIn = pSVar11 + 1;
        pGen->pEnd = pSVar10;
        if (sVar3 == -10) {
          return -10;
        }
        jx9VmEmitInstr(pGen->pVm,9,0,0,(void *)0x0,&local_44);
        local_38 = 9;
        local_34 = local_44;
        SySetPut(&local_40->aJumpFix,&local_38);
        sVar3 = jx9CompileBlock(pGen);
        if (sVar3 == -10) {
          return -10;
        }
        pSVar9 = pGen->pIn;
        if (((pGen->pEnd <= pSVar9) || ((pSVar9->nType & 4) == 0)) ||
           (uVar2 = *(uint *)&pSVar9->pUserData, (uVar2 & 0xc000000) == 0)) {
LAB_001258ec:
          GenStateFixJumps(local_40,9,pGen->pVm->pByteContainer->nUsed);
          pSVar9 = pGen->pIn;
          if (((pSVar9 < pGen->pEnd) && ((pSVar9->nType & 4) != 0)) &&
             (((ulong)pSVar9->pUserData & 0x8000000) != 0)) {
            pGen->pIn = pSVar9 + 1;
            sVar3 = jx9CompileBlock(pGen);
            if (sVar3 == -10) {
              return -10;
            }
          }
          local_44 = pGen->pVm->pByteContainer->nUsed;
          GenStateFixJumps(local_40,8,local_44);
          pBlock = pGen->pCurrent;
          if (pBlock != (GenBlock *)0x0) {
            pGen->pCurrent = pBlock->pParent;
            GenStateFreeBlock(pBlock);
            return 0;
          }
          return 0;
        }
        jx9VmEmitInstr(pGen->pVm,8,0,0,(void *)0x0,&local_44);
        local_38 = 8;
        local_34 = local_44;
        SySetPut(&local_40->aJumpFix,&local_38);
        pSVar9 = pGen->pIn;
        if (((uVar2 >> 0x1b & 1) != 0) &&
           (((pGen->pEnd <= pSVar9 + 1 || ((pSVar9[1].nType & 4) == 0)) ||
            (pSVar10 = pSVar9 + 1, pSVar9 = pSVar9 + 1, *(int *)&pSVar10->pUserData != 3))))
        goto LAB_001258ec;
        pSVar9 = pSVar9 + 1;
        pGen->pIn = pSVar9;
        GenStateFixJumps(local_40,9,pGen->pVm->pByteContainer->nUsed);
        pSVar10 = pGen->pEnd;
      } while (pSVar9 < pSVar10);
      lVar4 = -0x20;
    }
LAB_001259a6:
    sVar7 = -10;
    sVar3 = jx9GenCompileError(pGen,1,*(sxu32 *)((long)&pSVar9->nLine + lVar4),
                               "if/else/elseif: Missing \'(\'");
    if (sVar3 != -10) {
LAB_001259ca:
      sVar7 = 0;
      pSVar9 = pGen->pIn;
      while ((pSVar9 < pGen->pEnd && ((pSVar9->nType & 0x40040) == 0))) {
        pGen->pIn = pSVar9 + 1;
        pSVar9 = pSVar9 + 1;
      }
    }
  }
  return sVar7;
}

Assistant:

static sxi32 jx9CompileIf(jx9_gen_state *pGen)
{
	SyToken *pToken, *pTmp, *pEnd = 0;
	GenBlock *pCondBlock = 0;
	sxu32 nJumpIdx;
	sxu32 nKeyID;
	sxi32 rc;
	/* Jump the 'if' keyword */
	pGen->pIn++;
	pToken = pGen->pIn; 
	/* Create the conditional block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_COND, jx9VmInstrLength(pGen->pVm), 0, &pCondBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Process as many [if/else if/elseif/else] blocks as we can */
	for(;;){
		if( pToken >= pGen->pEnd || (pToken->nType & JX9_TK_LPAREN) == 0 ){
			/* Syntax error */
			if( pToken >= pGen->pEnd ){
				pToken--;
			}
			rc = jx9GenCompileError(pGen, E_ERROR, pToken->nLine, "if/else/elseif: Missing '('");
			if( rc == SXERR_ABORT ){
				/* Error count limit reached, abort immediately */
				return SXERR_ABORT;
			}
			goto Synchronize;
		}
		/* Jump the left parenthesis '(' */
		pToken++; 
		/* Delimit the condition */
		jx9DelimitNestedTokens(pToken, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
		if( pToken >= pEnd || (pEnd->nType & JX9_TK_RPAREN) == 0 ){
			/* Syntax error */
			if( pToken >= pGen->pEnd ){
				pToken--;
			}
			rc = jx9GenCompileError(pGen, E_ERROR, pToken->nLine, "if/else/elseif: Missing ')'");
			if( rc == SXERR_ABORT ){
				/* Error count limit reached, abort immediately */
				return SXERR_ABORT;
			}
			goto Synchronize;
		}
		/* Swap token streams */
		SWAP_TOKEN_STREAM(pGen, pToken, pEnd);
		/* Compile the condition */
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		/* Update token stream */
		while(pGen->pIn < pEnd ){
			jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Unexpected token '%z'", &pGen->pIn->sData);
			pGen->pIn++;
		}
		pGen->pIn  = &pEnd[1];
		pGen->pEnd = pTmp;
		if( rc == SXERR_ABORT ){
			/* Expression handler request an operation abort [i.e: Out-of-memory] */
			return SXERR_ABORT;
		}
		/* Emit the false jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nJumpIdx);
		/* Save the instruction index so we can fix it later when the jump destination is resolved */
		GenStateNewJumpFixup(pCondBlock, JX9_OP_JZ, nJumpIdx);
		/* Compile the body */
		rc = jx9CompileBlock(&(*pGen));
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_KEYWORD) == 0 ){
			break;
		}
		/* Ensure that the keyword ID is 'else if' or 'else' */
		nKeyID = (sxu32)SX_PTR_TO_INT(pGen->pIn->pUserData);
		if( (nKeyID & (JX9_TKWRD_ELSE|JX9_TKWRD_ELIF)) == 0 ){
			break;
		}
		/* Emit the unconditional jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, 0, 0, &nJumpIdx);
		/* Save the instruction index so we can fix it later when the jump destination is resolved */
		GenStateNewJumpFixup(pCondBlock, JX9_OP_JMP, nJumpIdx);
		if( nKeyID & JX9_TKWRD_ELSE ){
			pToken = &pGen->pIn[1];
			if( pToken >= pGen->pEnd || (pToken->nType & JX9_TK_KEYWORD) == 0 ||
				SX_PTR_TO_INT(pToken->pUserData) != JX9_TKWRD_IF ){
					break;
			}
			pGen->pIn++; /* Jump the 'else' keyword */
		}
		pGen->pIn++; /* Jump the 'elseif/if' keyword */
		/* Synchronize cursors */
		pToken = pGen->pIn;
		/* Fix the false jump */
		GenStateFixJumps(pCondBlock, JX9_OP_JZ, jx9VmInstrLength(pGen->pVm));
	} /* For(;;) */
	/* Fix the false jump */
	GenStateFixJumps(pCondBlock, JX9_OP_JZ, jx9VmInstrLength(pGen->pVm));
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_KEYWORD) &&
		(SX_PTR_TO_INT(pGen->pIn->pUserData) & JX9_TKWRD_ELSE) ){
			/* Compile the else block */
			pGen->pIn++;
			rc = jx9CompileBlock(&(*pGen));
			if( rc == SXERR_ABORT ){
				
				return SXERR_ABORT;
			}
	}
	nJumpIdx = jx9VmInstrLength(pGen->pVm);
	/* Fix all unconditional jumps now the destination is resolved */
	GenStateFixJumps(pCondBlock, JX9_OP_JMP, nJumpIdx);
	/* Release the conditional block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon ';' so we can avoid compiling this erroneous block.
	 */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}